

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O3

void png_set_compression_method(png_structrp png_ptr,int method)

{
  if (png_ptr != (png_structrp)0x0) {
    if (method != 8) {
      png_warning(png_ptr,"Only compression method 8 is supported by PNG");
    }
    png_ptr->zlib_method = method;
  }
  return;
}

Assistant:

void PNGAPI
png_set_compression_method(png_structrp png_ptr, int method)
{
   png_debug(1, "in png_set_compression_method");

   if (png_ptr == NULL)
      return;

   /* This would produce an invalid PNG file if it worked, but it doesn't and
    * deflate will fault it, so it is harmless to just warn here.
    */
   if (method != 8)
      png_warning(png_ptr, "Only compression method 8 is supported by PNG");

   png_ptr->zlib_method = method;
}